

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O2

void __thiscall
cmFindProgramCommand::cmFindProgramCommand(cmFindProgramCommand *this,cmExecutionStatus *status)

{
  cmMakefile *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  cmValue l;
  string_view r;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"find_program",(allocator<char> *)&local_58);
  cmFindBase::cmFindBase(&this->super_cmFindBase,&local_38,status);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_cmFindBase)._vptr_cmFindBase = (_func_int **)&PTR__cmFindBase_007d1ec0;
  (this->super_cmFindBase).NamesPerDirAllowed = true;
  std::__cxx11::string::assign((char *)&(this->super_cmFindBase).VariableDocumentation);
  (this->super_cmFindBase).VariableType = FILEPATH;
  PVar2 = cmMakefile::GetPolicyStatus
                    ((this->super_cmFindBase).super_cmFindCommon.Makefile,CMP0134,false);
  if (PVar2 == NEW) {
    (this->super_cmFindBase).super_cmFindCommon.RegistryView = Both;
  }
  else {
    this_00 = (this->super_cmFindBase).super_cmFindCommon.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"CMAKE_SIZEOF_VOID_P",&local_59);
    l = cmMakefile::GetDefinition(this_00,&local_58);
    r._M_str = "8";
    r._M_len = 1;
    bVar1 = ::operator==(l,r);
    std::__cxx11::string::~string((string *)&local_58);
    if (bVar1) {
      (this->super_cmFindBase).super_cmFindCommon.RegistryView = Reg64_32;
    }
    else {
      (this->super_cmFindBase).super_cmFindCommon.RegistryView = Reg32_64;
    }
  }
  return;
}

Assistant:

cmFindProgramCommand::cmFindProgramCommand(cmExecutionStatus& status)
  : cmFindBase("find_program", status)
{
  this->NamesPerDirAllowed = true;
  this->VariableDocumentation = "Path to a program.";
  this->VariableType = cmStateEnums::FILEPATH;
  // Windows Registry views
  // When policy CMP0134 is not NEW, rely on previous behavior:
  if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0134) !=
      cmPolicies::NEW) {
    if (this->Makefile->GetDefinition("CMAKE_SIZEOF_VOID_P") == "8") {
      this->RegistryView = cmWindowsRegistry::View::Reg64_32;
    } else {
      this->RegistryView = cmWindowsRegistry::View::Reg32_64;
    }
  } else {
    this->RegistryView = cmWindowsRegistry::View::Both;
  }
}